

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addJacobianBlock
          (MultipleShootingTranscription *this,size_t initRow,size_t rows,size_t initCol,size_t cols
          )

{
  MultipleShootingTranscription *in_RCX;
  ulong in_RDX;
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  size_t j;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *toBeAdded;
  ulong position;
  
  for (position = 0; position < in_RDX; position = position + 1) {
    for (toBeAdded = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0; toBeAdded < in_R8
        ; toBeAdded = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      ((long)&(toBeAdded->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1)) {
      addNonZero(in_RCX,in_R8,position,(size_t)toBeAdded);
      addNonZero(in_RCX,in_R8,position,(size_t)toBeAdded);
      *(long *)(in_RDI + 0x288) = *(long *)(in_RDI + 0x288) + 1;
    }
  }
  return;
}

Assistant:

void addJacobianBlock(size_t initRow, size_t rows, size_t initCol, size_t cols){
                for (size_t i = 0; i < rows; ++i){
                    for (size_t j = 0; j < cols; ++j){
                        addNonZero(m_jacobianNZRows, m_jacobianNonZeros, initRow + i);
                        addNonZero(m_jacobianNZCols, m_jacobianNonZeros, initCol + j);
                        m_jacobianNonZeros++;
                    }
                }
            }